

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::C_formatter<spdlog::details::scoped_padder>::format
          (C_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t sVar1;
  byte bVar2;
  buffer<char> *buf;
  ulong uVar3;
  uint uVar4;
  basic_string_view<char> fmt;
  scoped_padder p;
  scoped_padder local_90;
  uint local_68 [6];
  char *local_50;
  undefined8 local_48;
  undefined4 local_40;
  memory_buf_t *local_38;
  undefined8 local_30;
  uint *local_28;
  undefined8 local_20;
  
  scoped_padder::scoped_padder(&local_90,2,&(this->super_flag_formatter).padinfo_,dest);
  uVar4 = tm_time->tm_year % 100;
  if (uVar4 < 100) {
    sVar1 = (dest->super_buffer<char>).size_;
    uVar3 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar3 = sVar1 + 1;
    }
    bVar2 = (byte)((uVar4 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar1] = bVar2 | 0x30;
    sVar1 = (dest->super_buffer<char>).size_;
    uVar3 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar3 = sVar1 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar3;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar4 + bVar2 * -10 | 0x30;
  }
  else {
    local_28 = local_68;
    local_50 = "{:02}";
    local_48 = 5;
    local_40 = 0;
    local_30 = 1;
    local_20 = 0;
    fmt.size_ = (size_t)&local_50;
    fmt.data_ = (char *)0x5;
    local_68[0] = uVar4;
    local_38 = dest;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt,(format_handler<char> *)((ulong)(long)tm_time->tm_year >> 0x3f)
              );
  }
  scoped_padder::~scoped_padder(&local_90);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }